

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RectMatrix.hpp
# Opt level: O2

double OpenMD::doubleDot<double,3u,3u>
                 (RectMatrix<double,_3U,_3U> *t1,RectMatrix<double,_3U,_3U> *t2)

{
  uint i;
  long lVar1;
  uint j;
  long lVar2;
  double tmp;
  
  tmp = 0.0;
  for (lVar1 = 0; lVar1 != 3; lVar1 = lVar1 + 1) {
    for (lVar2 = 0; lVar2 != 3; lVar2 = lVar2 + 1) {
      tmp = tmp + (*(double (*) [3])*(double (*) [3])t1)[lVar2] *
                  (*(double (*) [3])*(double (*) [3])t2)[lVar2];
    }
    t1 = (RectMatrix<double,_3U,_3U> *)((long)t1 + 0x18);
    t2 = (RectMatrix<double,_3U,_3U> *)((long)t2 + 0x18);
  }
  return tmp;
}

Assistant:

inline Real doubleDot(const RectMatrix<Real, Row, Col>& t1,
                        const RectMatrix<Real, Row, Col>& t2) {
    Real tmp;
    tmp = 0;

    for (unsigned int i = 0; i < Row; i++)
      for (unsigned int j = 0; j < Col; j++)
        tmp += t1(i, j) * t2(i, j);

    return tmp;
  }